

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O2

int roslz4_buffToBuffCompress
              (char *input,uint input_size,char *output,uint *output_size,int block_size_id)

{
  uint uVar1;
  roslz4_stream stream;
  
  stream.output_left = *output_size;
  stream.input_next = input;
  stream.input_left = input_size;
  stream.output_next = output;
  uVar1 = roslz4_compressStart(&stream,block_size_id);
  if (uVar1 == 0) {
    uVar1 = 0;
    do {
      if ((uVar1 == 2) || (stream.input_left < 1)) {
        *output_size = *output_size - stream.output_left;
        streamStateFree(&stream);
        return -(uint)(uVar1 != 2 || stream.input_left != 0);
      }
      uVar1 = roslz4_compress(&stream,1);
    } while (uVar1 < 0xfffffffe);
  }
  streamStateFree(&stream);
  return uVar1;
}

Assistant:

int roslz4_buffToBuffCompress(char *input, unsigned int input_size,
                              char *output, unsigned int *output_size,
                              int block_size_id) {
  roslz4_stream stream;
  stream.input_next = input;
  stream.input_left = input_size;
  stream.output_next = output;
  stream.output_left = *output_size;

  int ret;
  ret = roslz4_compressStart(&stream, block_size_id);
  if (ret != ROSLZ4_OK) {
    roslz4_compressEnd(&stream);
    return ret;
  }

  while (stream.input_left > 0 && ret != ROSLZ4_STREAM_END) {
    ret = roslz4_compress(&stream, ROSLZ4_FINISH);
    if (ret == ROSLZ4_ERROR || ret == ROSLZ4_OUTPUT_SMALL) {
      roslz4_compressEnd(&stream);
      return ret;
    }
  }

  *output_size = *output_size - stream.output_left;
  roslz4_compressEnd(&stream);

  if (stream.input_left == 0 && ret == ROSLZ4_STREAM_END) {
    return ROSLZ4_OK; // Success
  } else {
    return ROSLZ4_ERROR; // User did not provide exact buffer
  }
}